

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void predict_dc_only_block
               (MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,int block,int blk_row
               ,int blk_col,RD_STATS *best_rd_stats,int64_t *block_sse,uint *block_mse_q8,
               int64_t *per_px_mean,int *dc_only_blk)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  MACROBLOCKD *xd_00;
  int64_t iVar7;
  ulong uVar8;
  long lVar9;
  byte in_CL;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  double dVar10;
  int *in_stack_00000010;
  long *in_stack_00000018;
  int zero_blk_rate;
  PLANE_TYPE plane_type;
  TXB_CTX *in_stack_00000020;
  TXB_CTX txb_ctx_tmp;
  TX_SIZE txs_ctx;
  ENTROPY_CONTEXT *tl;
  ENTROPY_CONTEXT *ta;
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  uint predict_dc_level;
  uint64_t var_threshold;
  int dc_qstep;
  uint64_t block_var;
  int qstep;
  int dequant_shift;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MB_MODE_INFO *mbmi_00;
  macroblockd_plane *pd;
  undefined4 in_stack_ffffffffffffff44;
  undefined2 uVar11;
  int local_b4;
  BLOCK_SIZE in_stack_ffffffffffffff92;
  BLOCK_SIZE in_stack_ffffffffffffff93;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  MACROBLOCK *in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  ulong uVar12;
  byte local_34;
  
  uVar11 = (undefined2)((uint)in_stack_ffffffffffffff44 >> 0x10);
  xd_00 = (MACROBLOCKD *)(in_RDI + 0x1a0);
  iVar4 = is_cur_buf_hbd(xd_00);
  if (iVar4 == 0) {
    iVar4 = 3;
  }
  else {
    iVar4 = *(int *)(in_RDI + 0x2b40) + -5;
  }
  sVar1 = *(short *)(*(long *)(in_RDI + 0x80 + (long)in_ESI * 0x88) + 2);
  local_34 = (byte)iVar4;
  uVar12 = 0xffffffffffffffff;
  iVar5 = (int)**(short **)(in_RDI + 0x80 + (long)in_ESI * 0x88) >> 3;
  pd = (macroblockd_plane *)&stack0xffffffffffffffc0;
  mbmi_00 = stack0x00000028;
  iVar7 = pixel_diff_stats(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                           in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                           in_stack_ffffffffffffff93,in_stack_ffffffffffffff92,
                           in_stack_ffffffffffffffb0,
                           (int64_t *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                           (uint64_t *)0xffffffffffffffff);
  *in_stack_00000018 = iVar7;
  dVar10 = (double)((int)sVar1 >> (local_34 & 0x1f));
  dVar10 = dVar10 * 1.8 * dVar10;
  uVar8 = (ulong)dVar10;
  uVar8 = uVar8 | (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f;
  iVar6 = is_cur_buf_hbd(xd_00);
  if (iVar6 != 0) {
    uVar12 = uVar12 + (long)((1 << (((char)*(undefined4 *)(in_RDI + 0x2b40) + -8) * '\x02' & 0x1fU))
                            >> 1) >>
             (((char)*(undefined4 *)(in_RDI + 0x2b40) + -8) * '\x02' & 0x3fU);
  }
  if (uVar12 < uVar8) {
    lVar9 = *(long *)stack0x00000028;
    if (lVar9 < 1) {
      lVar9 = -lVar9;
    }
    if ((long)(lVar9 * (ulong)dc_coeff_scale[in_CL]) < (long)(iVar5 << 0xc)) {
      *(undefined1 *)(in_stack_00000010 + 8) = 1;
      *(undefined2 *)(*(long *)(in_RDI + (long)in_ESI * 0x88 + 0x20) + (long)in_R8D * 2) = 0;
      iVar5 = is_cur_buf_hbd(xd_00);
      if (iVar5 != 0) {
        *in_stack_00000018 =
             *in_stack_00000018 +
             (long)((1 << (((char)*(undefined4 *)(in_RDI + 0x2b40) + -8) * '\x02' & 0x1fU)) >> 1) >>
             (((char)*(undefined4 *)(in_RDI + 0x2b40) + -8) * '\x02' & 0x3fU);
      }
      *(long *)(in_stack_00000010 + 2) = *in_stack_00000018 << 4;
      *(undefined8 *)(in_stack_00000010 + 6) = *(undefined8 *)(in_stack_00000010 + 2);
      av1_get_entropy_contexts
                ((BLOCK_SIZE)((ushort)uVar11 >> 8),pd,(ENTROPY_CONTEXT *)mbmi_00,
                 (ENTROPY_CONTEXT *)in_stack_00000020);
      bVar2 = get_txsize_entropy_ctx(in_CL);
      bVar3 = get_plane_type(in_ESI);
      get_txb_ctx((BLOCK_SIZE)((ushort)uVar11 >> 8),(TX_SIZE)uVar11,iVar4,(ENTROPY_CONTEXT *)pd,
                  (ENTROPY_CONTEXT *)mbmi_00,in_stack_00000020);
      *in_stack_00000010 =
           *(int *)(in_RDI + (ulong)bVar2 * 0x1d80 + (ulong)bVar3 * 0xec0 + 0xb9dc +
                   (long)local_b4 * 8);
      *(long *)(in_stack_00000010 + 4) =
           ((long)*in_stack_00000010 * (long)*(int *)(in_RDI + 0x4218) + 0x100 >> 9) +
           *(long *)(in_stack_00000010 + 6) * 0x80;
      *(undefined1 *)(*(long *)(in_RDI + (long)in_ESI * 0x88 + 0x28) + (long)in_R8D) = 0;
    }
    else if ((1 < *(uint *)(in_RDI + 0x24df4)) &&
            ((in_ESI == 0 || ((0 < in_ESI && (iVar4 = is_inter_block(mbmi_00), iVar4 != 0)))))) {
      tl[0] = '\x01';
      tl[1] = '\0';
      tl[2] = '\0';
      tl[3] = '\0';
    }
  }
  return;
}

Assistant:

static inline void predict_dc_only_block(
    MACROBLOCK *x, int plane, BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
    int block, int blk_row, int blk_col, RD_STATS *best_rd_stats,
    int64_t *block_sse, unsigned int *block_mse_q8, int64_t *per_px_mean,
    int *dc_only_blk) {
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = x->plane[plane].dequant_QTX[1] >> dequant_shift;
  uint64_t block_var = UINT64_MAX;
  const int dc_qstep = x->plane[plane].dequant_QTX[0] >> 3;
  *block_sse = pixel_diff_stats(x, plane, blk_row, blk_col, plane_bsize,
                                txsize_to_bsize[tx_size], block_mse_q8,
                                per_px_mean, &block_var);
  assert((*block_mse_q8) != UINT_MAX);
  uint64_t var_threshold = (uint64_t)(1.8 * qstep * qstep);
  if (is_cur_buf_hbd(xd))
    block_var = ROUND_POWER_OF_TWO(block_var, (xd->bd - 8) * 2);

  if (block_var >= var_threshold) return;
  const unsigned int predict_dc_level = x->txfm_search_params.predict_dc_level;
  assert(predict_dc_level != 0);

  // Prediction of skip block if residual mean and variance are less
  // than qstep based threshold
  if ((llabs(*per_px_mean) * dc_coeff_scale[tx_size]) < (dc_qstep << 12)) {
    // If the normalized mean of residual block is less than the dc qstep and
    // the  normalized block variance is less than ac qstep, then the block is
    // assumed to be a skip block and its rdcost is updated accordingly.
    best_rd_stats->skip_txfm = 1;

    x->plane[plane].eobs[block] = 0;

    if (is_cur_buf_hbd(xd))
      *block_sse = ROUND_POWER_OF_TWO((*block_sse), (xd->bd - 8) * 2);

    best_rd_stats->dist = (*block_sse) << 4;
    best_rd_stats->sse = best_rd_stats->dist;

    ENTROPY_CONTEXT ctxa[MAX_MIB_SIZE];
    ENTROPY_CONTEXT ctxl[MAX_MIB_SIZE];
    av1_get_entropy_contexts(plane_bsize, &xd->plane[plane], ctxa, ctxl);
    ENTROPY_CONTEXT *ta = ctxa;
    ENTROPY_CONTEXT *tl = ctxl;
    const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
    TXB_CTX txb_ctx_tmp;
    const PLANE_TYPE plane_type = get_plane_type(plane);
    get_txb_ctx(plane_bsize, tx_size, plane, ta, tl, &txb_ctx_tmp);
    const int zero_blk_rate = x->coeff_costs.coeff_costs[txs_ctx][plane_type]
                                  .txb_skip_cost[txb_ctx_tmp.txb_skip_ctx][1];
    best_rd_stats->rate = zero_blk_rate;

    best_rd_stats->rdcost =
        RDCOST(x->rdmult, best_rd_stats->rate, best_rd_stats->sse);

    x->plane[plane].txb_entropy_ctx[block] = 0;
  } else if (predict_dc_level > 1) {
    // Predict DC only blocks based on residual variance.
    // For chroma plane, this prediction is disabled for intra blocks.
    if ((plane == 0) || (plane > 0 && is_inter_block(mbmi))) *dc_only_blk = 1;
  }
}